

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkUtil.c
# Opt level: O2

void Nwk_ObjPrint(Nwk_Obj_t *pObj)

{
  int iVar1;
  long lVar2;
  
  printf("ObjId = %5d.  ",(ulong)(uint)pObj->Id);
  iVar1 = Nwk_ObjIsPi(pObj);
  if (iVar1 != 0) {
    printf("PI");
  }
  iVar1 = Nwk_ObjIsPo(pObj);
  if (iVar1 != 0) {
    printf("PO");
  }
  if ((*(uint *)&pObj->field_0x20 & 7) == 3) {
    printf("Node");
  }
  printf("   Fanins = ");
  for (lVar2 = 0; (lVar2 < pObj->nFanins && (pObj->pFanio[lVar2] != (Nwk_Obj_t *)0x0));
      lVar2 = lVar2 + 1) {
    printf("%d ",(ulong)(uint)pObj->pFanio[lVar2]->Id);
  }
  printf("   Fanouts = ");
  for (lVar2 = 0; (int)lVar2 < pObj->nFanouts; lVar2 = lVar2 + 1) {
    if (pObj->pFanio[pObj->nFanins + lVar2] == (Nwk_Obj_t *)0x0) break;
    printf("%d ",(ulong)(uint)pObj->pFanio[pObj->nFanins + lVar2]->Id);
  }
  putchar(10);
  return;
}

Assistant:

void Nwk_ObjPrint( Nwk_Obj_t * pObj )
{
    Nwk_Obj_t * pNext;
    int i;
    printf( "ObjId = %5d.  ", pObj->Id );
    if ( Nwk_ObjIsPi(pObj) )
        printf( "PI" );
    if ( Nwk_ObjIsPo(pObj) )
        printf( "PO" );
    if ( Nwk_ObjIsNode(pObj) )
        printf( "Node" );
    printf( "   Fanins = " );
    Nwk_ObjForEachFanin( pObj, pNext, i )
        printf( "%d ", pNext->Id );
    printf( "   Fanouts = " );
    Nwk_ObjForEachFanout( pObj, pNext, i )
        printf( "%d ", pNext->Id );
    printf( "\n" );
}